

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.cpp
# Opt level: O0

int mbedtls_md_hmac_finish(mbedtls_md_context_t *ctx,uchar *output)

{
  uchar *output_00;
  long *in_RDI;
  uchar *opad;
  uchar tmp [32];
  int ret;
  mbedtls_md_context_t *in_stack_ffffffffffffffa8;
  mbedtls_md_context_t *in_stack_ffffffffffffffb8;
  int local_4;
  
  if (((in_RDI == (long *)0x0) || (*in_RDI == 0)) || (in_RDI[2] == 0)) {
    local_4 = -0x5100;
  }
  else {
    output_00 = (uchar *)(in_RDI[2] + (long)(int)(uint)*(byte *)(*in_RDI + 5));
    local_4 = mbedtls_md_finish(in_stack_ffffffffffffffb8,output_00);
    if (((local_4 == 0) && (local_4 = mbedtls_md_starts(in_stack_ffffffffffffffa8), local_4 == 0))
       && ((local_4 = mbedtls_md_update(in_stack_ffffffffffffffb8,output_00,
                                        (size_t)in_stack_ffffffffffffffa8), local_4 == 0 &&
           (local_4 = mbedtls_md_update(in_stack_ffffffffffffffb8,output_00,
                                        (size_t)in_stack_ffffffffffffffa8), local_4 == 0)))) {
      local_4 = mbedtls_md_finish(in_stack_ffffffffffffffb8,output_00);
    }
  }
  return local_4;
}

Assistant:

int mbedtls_md_hmac_finish(mbedtls_md_context_t *ctx, unsigned char *output)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char tmp[MBEDTLS_MD_MAX_SIZE];
    unsigned char *opad;

    if (ctx == NULL || ctx->md_info == NULL || ctx->hmac_ctx == NULL) {
        return MBEDTLS_ERR_MD_BAD_INPUT_DATA;
    }

    opad = (unsigned char *) ctx->hmac_ctx + ctx->md_info->block_size;

    if ((ret = mbedtls_md_finish(ctx, tmp)) != 0) {
        return ret;
    }
    if ((ret = mbedtls_md_starts(ctx)) != 0) {
        return ret;
    }
    if ((ret = mbedtls_md_update(ctx, opad,
                                 ctx->md_info->block_size)) != 0) {
        return ret;
    }
    if ((ret = mbedtls_md_update(ctx, tmp,
                                 ctx->md_info->size)) != 0) {
        return ret;
    }
    return mbedtls_md_finish(ctx, output);
}